

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool prvTidyIsWord2000(TidyDocImpl *doc)

{
  int iVar1;
  Node *pNVar2;
  AttVal *pAVar3;
  ctmbstr ptVar4;
  Node *html;
  Node *head;
  Node *node;
  AttVal *attval;
  TidyDocImpl *doc_local;
  
  pNVar2 = prvTidyFindHTML(doc);
  if ((pNVar2 == (Node *)0x0) ||
     (pAVar3 = prvTidyGetAttrByName(pNVar2,"xmlns:o"), pAVar3 == (AttVal *)0x0)) {
    pNVar2 = prvTidyFindHEAD(doc);
    if (pNVar2 != (Node *)0x0) {
      for (head = pNVar2->content; head != (Node *)0x0; head = head->next) {
        if ((((((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) &&
              (head->tag->id == TidyTag_META)) &&
             ((pAVar3 = prvTidyAttrGetById(head,TidyAttr_NAME), pAVar3 != (AttVal *)0x0 &&
              (pAVar3->value != (tmbstr)0x0)))) &&
            ((iVar1 = prvTidytmbstrcasecmp(pAVar3->value,"generator"), iVar1 == 0 &&
             ((pAVar3 = prvTidyAttrGetById(head,TidyAttr_CONTENT), pAVar3 != (AttVal *)0x0 &&
              (pAVar3->value != (tmbstr)0x0)))))) &&
           (ptVar4 = prvTidytmbsubstr(pAVar3->value,"Microsoft"), ptVar4 != (ctmbstr)0x0)) {
          return yes;
        }
      }
    }
    doc_local._4_4_ = no;
  }
  else {
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(IsWord2000)( TidyDocImpl* doc )
{
    AttVal *attval;
    Node *node, *head;
    Node *html = TY_(FindHTML)( doc );

    if (html && TY_(GetAttrByName)(html, "xmlns:o"))
        return yes;
    
    /* search for <meta name="GENERATOR" content="Microsoft ..."> */
    head = TY_(FindHEAD)( doc );

    if (head)
    {
        for (node = head->content; node; node = node->next)
        {
            if ( !nodeIsMETA(node) )
                continue;

            attval = TY_(AttrGetById)( node, TidyAttr_NAME );

            if ( !AttrValueIs(attval, "generator") )
                continue;

            attval =  TY_(AttrGetById)( node, TidyAttr_CONTENT );

            if ( AttrContains(attval, "Microsoft") )
                return yes;
        }
    }

    return no;
}